

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

char * StringBuilder<char[14],char_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&>
                 (char (*arg) [14],char *args,char (*args_1) [2],char *args_2,char (*args_3) [2],
                 char *args_4,char (*args_5) [2],char *args_6)

{
  char (*in_RSI) [2];
  char *in_RDI;
  char *in_R8;
  char (*in_R9) [2];
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_50 [8];
  char *in_stack_ffffffffffffffb8;
  char (*in_stack_ffffffffffffffc0) [2];
  char *in_stack_ffffffffffffffc8;
  char *args_5_00;
  
  args_5_00 = in_RDI;
  StringBuilder_abi_cxx11_(in_stack_ffffffffffffff88);
  StringBuilder<char,char_const(&)[2],char_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&>
            (in_R8,in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_RSI,args_5_00);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}